

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall crnlib::sparse_bit_array::set_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar3;
  uint32 msk_1;
  uint bits_to_set_1;
  uint group_bit_ofs_1;
  uint32 *pGroup_2;
  uint group_index_2;
  uint32 *pGroup_1;
  uint group_index_1;
  uint32 msk;
  uint bits_to_set;
  uint max_bits_to_set;
  uint dword_bit_ofs;
  uint group_bit_ofs;
  uint32 *pGroup;
  uint group_index;
  undefined1 clear;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32 *local_50;
  uint32 *local_40;
  uint32 *local_20;
  uint local_10;
  uint local_c;
  
  if (in_EDX != 0) {
    local_10 = in_EDX;
    local_c = in_ESI;
    if (in_EDX == 1) {
      set_bit((sparse_bit_array *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (uint)((ulong)in_RDI >> 0x20));
    }
    else {
      for (; bVar3 = (local_c & 0x1ff) != 0, clear = bVar3 || local_10 < 0x201,
          bVar3 || local_10 < 0x201; local_c = uVar1 + local_c) {
        local_20 = *(uint32 **)(*(long *)(in_RDI + 8) + (ulong)(local_c >> 9) * 8);
        if (local_20 == (uint32 *)0x0) {
          local_20 = alloc_group((bool)clear);
          *(uint32 **)(*(long *)(in_RDI + 8) + (ulong)(local_c >> 9) * 8) = local_20;
        }
        uVar1 = math::minimum<unsigned_int>(0x20 - (local_c & 0x1f),local_10);
        uVar2 = (local_c & 0x1ff) >> 5;
        local_20[uVar2] =
             (0xffffffffU >> (0x20U - (char)uVar1 & 0x1f)) << (sbyte)(local_c & 0x1f) |
             local_20[uVar2];
        local_10 = local_10 - uVar1;
        if (local_10 == 0) {
          return;
        }
      }
      for (; 0x1ff < local_10; local_10 = local_10 - 0x200) {
        local_40 = *(uint32 **)(*(long *)(in_RDI + 8) + (ulong)(local_c >> 9) * 8);
        if (local_40 == (uint32 *)0x0) {
          local_40 = alloc_group((bool)clear);
          *(uint32 **)(*(long *)(in_RDI + 8) + (ulong)(local_c >> 9) * 8) = local_40;
        }
        memset(local_40,0xff,0x40);
        local_c = local_c + 0x200;
      }
      for (; local_10 != 0; local_10 = local_10 - uVar1) {
        local_50 = *(uint32 **)(*(long *)(in_RDI + 8) + (ulong)(local_c >> 9) * 8);
        if (local_50 == (uint32 *)0x0) {
          local_50 = alloc_group((bool)clear);
          *(uint32 **)(*(long *)(in_RDI + 8) + (ulong)(local_c >> 9) * 8) = local_50;
        }
        uVar1 = math::minimum<unsigned_int>(0x20,local_10);
        uVar2 = (local_c & 0x1ff) >> 5;
        local_50[uVar2] =
             (0xffffffffU >> (0x20U - (char)uVar1 & 0x1f)) << ((byte)(local_c & 0x1ff) & 0x1f) |
             local_50[uVar2];
        local_c = uVar1 + local_c;
      }
    }
  }
  return;
}

Assistant:

void sparse_bit_array::set_bit_range(uint index, uint num) {
  CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

  if (!num)
    return;
  else if (num == 1) {
    set_bit(index);
    return;
  }

  while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup)) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    const uint group_bit_ofs = index & cBitsPerGroupMask;

    const uint dword_bit_ofs = group_bit_ofs & 31;
    const uint max_bits_to_set = 32 - dword_bit_ofs;

    const uint bits_to_set = math::minimum(max_bits_to_set, num);
    const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

    pGroup[group_bit_ofs >> 5] |= (msk << dword_bit_ofs);

    num -= bits_to_set;
    if (!num)
      return;

    index += bits_to_set;
  }

  while (num >= cBitsPerGroup) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    memset(pGroup, 0xFF, sizeof(uint32) * cDWORDsPerGroup);

    num -= cBitsPerGroup;
    index += cBitsPerGroup;
  }

  while (num) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    uint group_bit_ofs = index & cBitsPerGroupMask;

    uint bits_to_set = math::minimum(32U, num);
    uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

    pGroup[group_bit_ofs >> 5] |= (msk << (group_bit_ofs & 31));

    num -= bits_to_set;
    index += bits_to_set;
  }
}